

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseBase node;
  void *pvVar3;
  PromiseArena *in_RCX;
  TransformPromiseNodeBase *this_00;
  PromiseArena *pPVar4;
  OwnPromiseNode local_88;
  _func_int **local_80;
  PromiseArena *local_78;
  PromiseArena *local_70;
  PromiseBase local_68;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_5f;
  OwnPromiseNode intermediate;
  Fault f;
  
  _kjCondition.value = output[7]._vptr_AsyncOutputStream == (_func_int **)0x0;
  if (_kjCondition.value) {
    local_70 = (PromiseArena *)(output + 7);
    pPVar4 = (PromiseArena *)
             ((long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream);
    if (in_RCX < pPVar4) {
      pPVar4 = in_RCX;
    }
    local_78 = (PromiseArena *)amount2;
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_88,output[4]._vptr_AsyncOutputStream,amount2,pPVar4);
    OVar2.ptr = local_88.ptr;
    local_80 = output[2]._vptr_AsyncOutputStream;
    pPVar1 = ((local_88.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_88.ptr - (long)pPVar1) < 0x50) {
      pvVar3 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3b0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_88,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:825:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_32_4_39723cd8_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3b0) = &PTR_destroy_0070b7b0;
      *(AsyncOutputStream **)((long)pvVar3 + 0x3d0) = output;
      *(PromiseArena **)((long)pvVar3 + 0x3d8) = local_78;
      *(PromiseArena **)((long)pvVar3 + 0x3e0) = in_RCX;
      *(PromiseArena **)((long)pvVar3 + 1000) = pPVar4;
      *(_func_int ***)((long)pvVar3 + 0x3f0) = local_80;
      *(PromiseArena **)((long)pvVar3 + 0x3f8) = local_70;
      *(void **)((long)pvVar3 + 0x3b8) = pvVar3;
    }
    else {
      ((local_88.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_88.ptr + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_88,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:825:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_32_4_39723cd8_for_func::operator());
      OVar2.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0070b7b0;
      OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)output;
      OVar2.ptr[-3].super_PromiseArenaMember.arena = local_78;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)in_RCX;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = pPVar4;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = local_80;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = local_70;
      OVar2.ptr[-5].super_PromiseArenaMember.arena = pPVar1;
    }
    pPVar4 = local_70;
    f.exception = (Exception *)anon_var_dwarf_d49e5d;
    intermediate.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
    OVar2.ptr = intermediate.ptr;
    local_68.node.ptr._1_7_ = uStack_5f;
    local_68.node.ptr._0_1_ = _kjCondition.value;
    if (intermediate.ptr != (PromiseNode *)0x0) {
      intermediate.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)&f,(Canceler *)pPVar4,(Promise<unsigned_long> *)&local_68);
    node.node.ptr = local_68.node.ptr;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)f.exception;
    if (local_68.node.ptr != (PromiseNode *)0x0) {
      local_68.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    OVar2.ptr = local_88.ptr;
    if (&(local_88.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_88.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x335,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}